

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void mask_morph(Mat *mask)

{
  Mat dilateElement;
  Mat erodeElement;
  Mat local_f0 [96];
  Mat local_90 [96];
  
  cv::getStructuringElement(local_90,0);
  cv::getStructuringElement(local_f0,0);
  cv::erode();
  cv::erode();
  cv::dilate();
  cv::dilate();
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat(local_90);
  return;
}

Assistant:

void mask_morph(Mat &mask) {
    Mat erodeElement = getStructuringElement(MORPH_RECT, Size(3, 3));
    Mat dilateElement = getStructuringElement(MORPH_RECT, Size(8, 8));
    erode(mask, mask, erodeElement);
    erode(mask, mask, erodeElement);
    dilate(mask, mask, dilateElement);
    dilate(mask, mask, dilateElement);
}